

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_level_iterator.cc
# Opt level: O0

Iterator *
leveldb::NewTwoLevelIterator
          (Iterator *index_iter,BlockFunction block_function,void *arg,ReadOptions *options)

{
  Iterator *pIVar1;
  ReadOptions *in_RCX;
  void *in_RDX;
  BlockFunction in_RSI;
  Iterator *in_RDI;
  TwoLevelIterator *unaff_retaddr;
  
  pIVar1 = (Iterator *)operator_new(0xb8);
  anon_unknown_8::TwoLevelIterator::TwoLevelIterator(unaff_retaddr,in_RDI,in_RSI,in_RDX,in_RCX);
  return pIVar1;
}

Assistant:

Iterator* NewTwoLevelIterator(Iterator* index_iter,
                              BlockFunction block_function, void* arg,
                              const ReadOptions& options) {
  return new TwoLevelIterator(index_iter, block_function, arg, options);
}